

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::doWalkFunction(I64ToI32Lowering *this,Function *func)

{
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_00;
  Module *pMVar1;
  pointer pTVar2;
  undefined1 auVar3 [16];
  Index IVar4;
  bool bVar5;
  Index IVar6;
  pointer __p;
  pointer __p_00;
  Function *func_00;
  size_t sVar7;
  wasm *this_01;
  Type TVar8;
  mapped_type *pmVar9;
  uint uVar10;
  code *pcVar11;
  ulong in_R8;
  mapped_type mVar12;
  Name NVar13;
  undefined1 local_3b0 [8];
  Module temp;
  char *local_60;
  Index local_34;
  
  Flat::verifyFlatness(func);
  if ((this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
      ._M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl == (Builder *)0x0) {
    pMVar1 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
             ).
             super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
             super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
             currModule;
    __p_00 = (pointer)operator_new(8);
    __p_00->wasm = pMVar1;
    local_3b0 = (undefined1  [8])0x0;
    std::__uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>::reset
              ((__uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_> *)&this->builder
               ,__p_00);
    std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::~unique_ptr
              ((unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)local_3b0);
  }
  this_00 = &this->indexMap;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&this_00->_M_h);
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->highBitVars)._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->freeTemps)._M_h);
  Module::Module((Module *)local_3b0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_R8;
  func_00 = wasm::ModuleUtils::copyFunction
                      ((ModuleUtils *)func,(Function *)local_3b0,(Module *)0x0,
                       (Name)(auVar3 << 0x40));
  Function::setParams(func,(Type)0x0);
  pTVar2 = (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar2) {
    (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar2;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(func->localNames)._M_h);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(func->localIndices)._M_h);
  Names::ensureNames(func_00);
  uVar10 = 0;
  mVar12 = 0;
  while( true ) {
    local_34 = uVar10;
    sVar7 = Function::getNumLocals(func_00);
    if (sVar7 <= uVar10) {
      sVar7 = Function::getNumLocals(func);
      this->nextTemp = (Index)sVar7;
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::walk
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,&func->body);
      Module::~Module((Module *)local_3b0);
      return;
    }
    bVar5 = Function::hasLocalName(func_00,local_34);
    if (!bVar5) break;
    NVar13 = Function::getLocalName(func_00,local_34);
    this_01 = NVar13.super_IString.str._M_len;
    NVar13.super_IString.str._M_len = (size_t)NVar13.super_IString.str._M_str;
    join_0x00000010_0x00000000_ = (string_view)makeHighName(this_01,NVar13);
    TVar8 = Function::getLocalType(func_00,local_34);
    IVar4 = local_34;
    IVar6 = Function::getVarIndexBase(func_00);
    pcVar11 = Builder::addVar;
    if (IVar4 < IVar6) {
      pcVar11 = Builder::addParam;
    }
    if (TVar8.id == 3) {
      (*pcVar11)(func,this_01,NVar13.super_IString.str._M_str,2);
      (*pcVar11)(func,temp.tagsMap._M_h._M_single_bucket,local_60,2);
      pmVar9 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_34);
      *pmVar9 = mVar12;
      mVar12 = mVar12 + 2;
    }
    else {
      (*pcVar11)(func,this_01,NVar13.super_IString.str._M_str,TVar8.id);
      pmVar9 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_34);
      *pmVar9 = mVar12;
      mVar12 = mVar12 + 1;
    }
    uVar10 = local_34 + 1;
  }
  __assert_fail("oldFunc->hasLocalName(i)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0xab,"void wasm::I64ToI32Lowering::doWalkFunction(Function *)");
}

Assistant:

void doWalkFunction(Function* func) {
    Flat::verifyFlatness(func);
    // create builder here if this is first entry to module for this object
    if (!builder) {
      builder = std::make_unique<Builder>(*getModule());
    }
    indexMap.clear();
    highBitVars.clear();
    freeTemps.clear();
    Module temp;
    auto* oldFunc = ModuleUtils::copyFunction(func, temp);
    func->setParams(Type::none);
    func->vars.clear();
    func->localNames.clear();
    func->localIndices.clear();
    Index newIdx = 0;
    Names::ensureNames(oldFunc);
    for (Index i = 0; i < oldFunc->getNumLocals(); ++i) {
      assert(oldFunc->hasLocalName(i));
      Name lowName = oldFunc->getLocalName(i);
      Name highName = makeHighName(lowName);
      Type paramType = oldFunc->getLocalType(i);
      auto builderFunc =
        (i < oldFunc->getVarIndexBase())
          ? Builder::addParam
          : static_cast<Index (*)(Function*, Name, Type)>(Builder::addVar);
      if (paramType == Type::i64) {
        builderFunc(func, lowName, Type::i32);
        builderFunc(func, highName, Type::i32);
        indexMap[i] = newIdx;
        newIdx += 2;
      } else {
        builderFunc(func, lowName, paramType);
        indexMap[i] = newIdx++;
      }
    }
    nextTemp = func->getNumLocals();
    PostWalker<I64ToI32Lowering>::doWalkFunction(func);
  }